

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void do_fmlal(float32 *d,void *vn,void *vm,float_status *fpst,uint32_t desc,_Bool fz16)

{
  float32 fVar1;
  float32 xb;
  ulong uVar2;
  ulong uVar3;
  sbyte sVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uintptr_t i;
  ulong uVar8;
  float32 *pfVar9;
  
  uVar6 = (desc & 0x1f) * 8 + 8;
  uVar8 = (ulong)uVar6;
  uVar6 = (uint)(uVar6 == 0x10);
  uVar2 = (ulong)((desc >> 0xb & uVar6) << 3);
  sVar4 = (sbyte)((~uVar6 & desc >> 0xb & 1) << 5);
  uVar5 = *(ulong *)((long)vn + uVar2) >> sVar4;
  uVar2 = *(ulong *)((long)vm + uVar2);
  uVar3 = uVar5 ^ 0x8000800080008000;
  if ((desc >> 10 & 1) == 0) {
    uVar3 = uVar5;
  }
  pfVar9 = d;
  for (lVar7 = 0; (ulong)((desc & 0x1f) << 5) + 0x20 != lVar7; lVar7 = lVar7 + 0x10) {
    fVar1 = float16_to_float32_by_bits((uint32_t)(uVar3 >> ((byte)lVar7 & 0x3f)),fz16);
    xb = float16_to_float32_by_bits((uint32_t)((uVar2 >> sVar4) >> ((byte)lVar7 & 0x3f)),fz16);
    fVar1 = float32_muladd_aarch64(fVar1,xb,*pfVar9,0,fpst);
    *pfVar9 = fVar1;
    pfVar9 = pfVar9 + 1;
  }
  for (; uVar8 < (desc >> 2 & 0xf8) + 8; uVar8 = uVar8 + 8) {
    *(undefined8 *)((long)d + uVar8) = 0;
  }
  return;
}

Assistant:

static void do_fmlal(float32 *d, void *vn, void *vm, float_status *fpst,
                     uint32_t desc, bool fz16)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int is_s = extract32(desc, SIMD_DATA_SHIFT, 1);
    int is_2 = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    int is_q = oprsz == 16;
    uint64_t n_4, m_4;

    /* Pre-load all of the f16 data, avoiding overlap issues.  */
    n_4 = load4_f16(vn, is_q, is_2);
    m_4 = load4_f16(vm, is_q, is_2);

    /* Negate all inputs for FMLSL at once.  */
    if (is_s) {
        n_4 ^= 0x8000800080008000ull;
    }

    for (i = 0; i < oprsz / 4; i++) {
        float32 n_1 = float16_to_float32_by_bits(n_4 >> (i * 16), fz16);
        float32 m_1 = float16_to_float32_by_bits(m_4 >> (i * 16), fz16);
        d[H4(i)] = float32_muladd(n_1, m_1, d[H4(i)], 0, fpst);
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}